

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::writeHeader(PLYWriter *this)

{
  ofstream *poVar1;
  ply_encoding pVar2;
  pointer ppPVar3;
  pointer pPVar4;
  ostream *poVar5;
  PLYElement *pPVar6;
  size_t sVar7;
  size_t sVar8;
  int k;
  long lVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  string local_50;
  
  if (this->header_complete != false) {
    return;
  }
  poVar1 = &this->out;
  poVar5 = std::operator<<((ostream *)poVar1,"ply");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)poVar1,"format ");
  pVar2 = this->enc;
  if (pVar2 == ply_ascii) {
    pcVar10 = "ascii ";
  }
  else if (pVar2 == ply_little_endian) {
    pcVar10 = "binary_little_endian ";
  }
  else {
    if (pVar2 != ply_big_endian) goto LAB_00122cc0;
    pcVar10 = "binary_big_endian ";
  }
  std::operator<<((ostream *)poVar1,pcVar10);
LAB_00122cc0:
  poVar5 = std::operator<<((ostream *)poVar1,"1.0");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar12 = 0;
      ppPVar3 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->list).
                             super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3);
      uVar12 = uVar12 + 1) {
    pPVar6 = ppPVar3[uVar12];
    this->element = pPVar6;
    PLYElement::toString_abi_cxx11_(&local_50,pPVar6);
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar6 = this->element;
    if (0 < pPVar6->size) {
      lVar13 = 0;
      for (lVar9 = 0;
          pPVar4 = (pPVar6->list).
                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar9 < (int)((ulong)((long)(pPVar6->list).
                                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) >>
                       6); lVar9 = lVar9 + 1) {
        (anonymous_namespace)::PLYProperty::toString_abi_cxx11_
                  (&local_50,(PLYProperty *)((long)&pPVar4->enc + lVar13));
        poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_50);
        pPVar6 = this->element;
        lVar13 = lVar13 + 0x40;
      }
    }
  }
  poVar5 = std::operator<<((ostream *)poVar1,"end_header");
  std::operator<<(poVar5,"\n");
  this->header_complete = true;
  this->element = (PLYElement *)0x0;
  ppPVar3 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar7 = (long)(this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3;
  sVar8 = 0;
  while( true ) {
    if (sVar7 == sVar8) {
      this->pelem = sVar7;
      this->pinst = 1;
      this->pprop = 1;
      this->plist = 0;
      return;
    }
    pPVar6 = ppPVar3[sVar8];
    lVar9 = pPVar6->size;
    if ((0 < lVar9) &&
       (iVar11 = (int)((ulong)((long)(pPVar6->list).
                                     super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar6->list).
                                    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6), iVar11 != 0))
    break;
    sVar8 = sVar8 + 1;
  }
  this->pelem = sVar8;
  this->plist = 0;
  this->element = pPVar6;
  this->pinst = lVar9;
  this->pprop = iVar11 + 1;
  return;
}

Assistant:

void PLYWriter::writeHeader()
{
  if (!header_complete)
  {
    // write magic code

    out << "ply" << std::endl;

    // write encoding and version

    out << "format ";

    switch (enc)
    {
      case ply_ascii:
        out << "ascii ";
        break;

      case ply_big_endian:
        out << "binary_big_endian ";
        break;

      case ply_little_endian:
        out << "binary_little_endian ";
        break;

      default:
        break;
    }

    out << "1.0" << std::endl;

    // write all comments and elements

    for (size_t i=0; i<list.size(); i++)
    {
      element=list[i];

      out << element->toString() << std::endl;

      if (element->getInstances() > 0)
      {
        // write properties

        for (int k=0; k<element->getPropertyCount(); k++)
        {
          out << element->getProperty(k).toString() << std::endl;
        }
      }
    }

    out << "end_header" << "\n";

    header_complete=true;

    // set element pointer to first element with one or more properties and
    // one or more instances

    element=0;

    pelem=0;

    while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                   list[pelem]->getPropertyCount() == 0))
    {
      pelem++;
    }

    pinst=1;
    pprop=1;
    plist=0;

    if (pelem < list.size())
    {
      element=list[pelem];
      pinst=element->getInstances();
      pprop=element->getPropertyCount()+1;
    }
  }
}